

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

void f8n::env::OpenFile(string *path)

{
  char *__command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string command;
  string *path_local;
  
  command.field_2._8_8_ = path;
  std::operator+(&local_50,"xdg-open \'",path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"\' > /dev/null 2> /dev/null");
  std::__cxx11::string::~string((string *)&local_50);
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void OpenFile(const std::string& path) {
    #ifdef WIN32
        ShellExecuteA(nullptr, nullptr, path.c_str(), nullptr, nullptr, SW_SHOWNORMAL);
    #elif __APPLE__
        std::string command = "open '" + path + "' > /dev/null 2> /dev/null";
        system(command.c_str());
    #else
        std::string command = "xdg-open '" + path + "' > /dev/null 2> /dev/null";
        system(command.c_str());
    #endif
    }